

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QCom.cpp
# Opt level: O1

void server::forcespectator_cmd(int cid,char **args,int argc)

{
  bool bVar1;
  uint cn;
  int cn_00;
  uint uVar2;
  char *pcVar3;
  clientinfo *pcVar4;
  
  bVar1 = QServ::getlastSA(&qs);
  if (bVar1) {
    cn = atoi(args[1]);
    if (1000 < cn) {
      cn_00 = QServ::getSender(&qs);
      pcVar3 = QServ::getCommandDesc(&qs,cid);
      goto LAB_00156960;
    }
  }
  else {
    cn = QServ::getSender(&qs);
  }
  pcVar4 = QServ::getClient(&qs,cn);
  if (pcVar4 != (clientinfo *)0x0) {
    if (pcVar4->connected == true) {
      uVar2 = QServ::getSender(&qs);
      if ((((cn < 0x3e9) && (cn != uVar2)) && (pcVar4->connected == true)) &&
         (args[1] != (char *)0x0)) {
        pcVar4 = QServ::getClient(&qs,cn);
        forcespectator(pcVar4);
        return;
      }
    }
    return;
  }
  cn_00 = QServ::getSender(&qs);
  pcVar3 = "\f3Error: Player not connected";
LAB_00156960:
  sendf(cn_00,1,"ris",0x23,pcVar3);
  return;
}

Assistant:

QSERV_CALLBACK forcespectator_cmd(p) {
        bool usage = false;
        int cn = -1;
        if(CMD_SA) {
            cn = atoi(args[1]);
            if(cn >= 0 && cn <= 1000) {
                //if(!isalpha(cn)) {
                    forcespectatorprocess:
                    clientinfo *ci = qs.getClient(cn);

                    if(ci != NULL) {
                        if(ci->connected) {
                                if(cn!=CMD_SENDER && cn >= 0 && cn <= 1000 && ci != NULL && ci->connected && args[1] != NULL) {
                                clientinfo *ci = qs.getClient(cn);
                                forcespectator(ci);
                        }

                        }
                    } else {
                        sendf(CMD_SENDER, 1, "ris", N_SERVMSG, "\f3Error: Player not connected");
                    }
                /*} else {
                    usage = true;
                }*/
            } else {
                usage = true;
            }
        } else {
            cn = CMD_SENDER;
            goto forcespectatorprocess;
        }

        if(usage) sendf(CMD_SENDER, 1, "ris", N_SERVMSG, CMD_DESC(cid));
    }